

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::trimCommandPoolTest
          (TestStatus *__return_storage_ptr__,Context *context,VkCommandBufferLevel cmdBufferLevel)

{
  deInt32 *pdVar1;
  VkDevice *ppVVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  VkResult VVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  VkDevice pVVar10;
  DeviceInterface *vk;
  _func_int **pp_Var11;
  Handle<(vk::HandleType)24> HVar12;
  NotSupportedError *this;
  value_type *__val;
  ulong uVar13;
  TestStatus *pTVar14;
  value_type *__val_1;
  VkAllocationCallbacks **ppVVar15;
  int iVar16;
  ulong uVar17;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffers;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> cmdBuffersPeak;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  events;
  VkCommandPoolCreateInfo cmdPoolParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_148;
  TestStatus *local_128;
  Context *local_120;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> local_118;
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> local_f8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  local_d8;
  VkCommandPool local_b8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_b0;
  VkAllocationCallbacks **local_98;
  VkAllocationCallbacks **local_90;
  long local_88;
  ulong local_80;
  Move<vk::Handle<(vk::HandleType)10>_> local_78;
  ulong local_50;
  VkCommandPoolCreateInfo local_48;
  
  local_128 = __return_storage_ptr__;
  pvVar8 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar3 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar4 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                    (pbVar3,pbVar4,"VK_KHR_maintenance1");
  if (_Var9._M_current == pbVar4) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
               ,0x4cc);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar10 = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_120 = context;
  local_48.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = 2;
  ::vk::createCommandPool(&local_148,vk,pVVar10,&local_48,(VkAllocationCallbacks *)0x0);
  DStack_b0.m_device =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_b8.m_internal =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  DStack_b0.m_deviceIface =
       local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar16 = 10;
  do {
    ::vk::createEvent(&local_78,vk,pVVar10,0,(VkAllocationCallbacks *)0x0);
    pp_Var11 = (_func_int **)operator_new(0x20);
    pp_Var11[2] = (_func_int *)
                  local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
    pp_Var11[3] = (_func_int *)
                  local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator
    ;
    *pp_Var11 = (_func_int *)
                local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
    pp_Var11[1] = (_func_int *)
                  local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                  m_deviceIface;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
         (deUint64)pp_Var11;
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)operator_new(0x20);
    ((SharedPtrStateBase *)
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
    strongRefCount = 0;
    ((SharedPtrStateBase *)
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
    weakRefCount = 0;
    ((SharedPtrStateBase *)
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
    _vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1df10;
    ((SharedPtrStateBase *)
    ((long)local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface +
    0x10))->_vptr_SharedPtrStateBase = pp_Var11;
    ((SharedPtrStateBase *)
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
    strongRefCount = 1;
    ((SharedPtrStateBase *)
    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
    weakRefCount = 1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>>>>>
                *)&local_d8,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_> *)&local_148);
    if ((SharedPtrStateBase *)
        local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface !=
        (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_deviceIface + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
        (*(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
          _vptr_DeviceInterface[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_deviceIface + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface !=
            (SharedPtrStateBase *)0x0) {
          (*(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[1])();
        }
        local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
      }
    }
    if (local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()
                (&local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter,
                 (VkEvent)local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                          m_internal);
    }
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 0;
    local_78.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((VkAllocationCallbacks **)
                 local_118.
                 super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10);
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[8] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[9] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[6] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[7] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[4] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[5] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[2] = (VkAllocationCallbacks *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[3] = (VkAllocationCallbacks *)0x0;
  *local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
   _M_impl.super__Vector_impl_data._M_start = (VkCommandBuffer_s *)0x0;
  ((VkAllocationCallbacks **)
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_start)[1] = (VkAllocationCallbacks *)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x28;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)local_b8.m_internal;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ = 10;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ =
       cmdBufferLevel;
  local_118.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_98 = (VkAllocationCallbacks **)
             local_118.
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  VVar7 = (*vk->_vptr_DeviceInterface[0x47])(vk,pVVar10);
  ::vk::checkResult(VVar7,"vk.allocateCommandBuffers(vkDevice, &cmdBufParams, pCommandBuffers)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x48e);
  local_88 = -2;
  uVar17 = 0;
  local_90 = local_98;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar17;
    uVar13 = SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    local_80 = uVar17;
    addCommandsToBuffer(vk,&local_118,&local_d8);
    if (((uint)((int)local_80 * -0x33333333) >> 1 |
        (uint)(((int)local_80 * -0x33333333 & 1U) != 0) << 0x1f) < 0x1999999a) {
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = uVar13;
      HVar12.m_internal = (deUint64)operator_new(800);
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)HVar12.m_internal;
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)HVar12.m_internal;
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(HVar12.m_internal + 800);
      memset((void *)HVar12.m_internal,0,800);
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x28
      ;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)local_b8.m_internal;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
           100;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ =
           cmdBufferLevel;
      local_f8.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(HVar12.m_internal + 800);
      VVar7 = (*vk->_vptr_DeviceInterface[0x47])(vk,pVVar10,&local_148,HVar12.m_internal);
      ::vk::checkResult(VVar7,"vk.allocateCommandBuffers(vkDevice, &cmdBufParams, pCommandBuffers)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0x48e);
      addCommandsToBuffer(vk,&local_f8,&local_d8);
      if (cmdBufferLevel != VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
        if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
          bVar6 = executeSecondaryCmdBuffer(local_120,local_b8,&local_f8,&local_d8);
          if (!bVar6) {
            local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
                 (deUint64)
                 &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Fail","");
            pTVar14 = local_128;
            local_128->m_code = QP_TEST_RESULT_FAIL;
            (local_128->m_description)._M_dataplus._M_p =
                 (pointer)&(local_128->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128->m_description,
                       local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                       m_internal,
                       (long)&(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                               deleter.m_deviceIface)->_vptr_DeviceInterface +
                       local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                       m_internal);
            goto LAB_0042d2eb;
          }
        }
LAB_0042cfc3:
        (*vk->_vptr_DeviceInterface[0x48])(vk,pVVar10,local_b8.m_internal,100,HVar12.m_internal);
        operator_delete((void *)HVar12.m_internal,800);
        uVar13 = local_50;
        goto LAB_0042cff8;
      }
      bVar6 = submitAndCheck(local_120,&local_f8,&local_d8);
      if (bVar6) goto LAB_0042cfc3;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
           (deUint64)
           &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Fail","");
      pTVar14 = local_128;
      local_128->m_code = QP_TEST_RESULT_FAIL;
      (local_128->m_description)._M_dataplus._M_p = (pointer)&(local_128->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128->m_description,
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
                 (long)&(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                        m_deviceIface)->_vptr_DeviceInterface +
                 local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
LAB_0042d2eb:
      if ((VkDevice *)
          local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
          &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device) {
        operator_delete((void *)local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                object.m_internal,
                        (ulong)(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                deleter.m_device + 1));
      }
      pVVar10 = (VkDevice)0x320;
LAB_0042d309:
      operator_delete((void *)HVar12.m_internal,(ulong)pVVar10);
LAB_0042d30e:
      if (local_118.
          super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0042d325;
      pVVar10 = (VkDevice)
                ((long)local_118.
                       super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_118.
                      super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      HVar12.m_internal =
           (deUint64)
           local_118.
           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      goto LAB_0042d320;
    }
LAB_0042cff8:
    (*vk->_vptr_DeviceInterface[0x7e])(vk,pVVar10,local_b8.m_internal,0);
    uVar17 = local_88 + (uVar13 >> 1) * -3;
    ppVVar15 = local_90 + (uVar13 >> 1) * -3;
    if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_SECONDARY) {
      bVar6 = executeSecondaryCmdBuffer(local_120,local_b8,&local_118,&local_d8);
      if (!bVar6) {
        local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
             (deUint64)
             &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Fail","");
        pTVar14 = local_128;
        local_128->m_code = QP_TEST_RESULT_FAIL;
        (local_128->m_description)._M_dataplus._M_p = (pointer)&(local_128->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128->m_description,
                   local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                   ,(long)&(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal);
LAB_0042d241:
        if ((VkDevice *)
            local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
            &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device) {
          pVVar10 = local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device
                    + 1;
          HVar12.m_internal =
               local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
          goto LAB_0042d309;
        }
        goto LAB_0042d30e;
      }
    }
    else if (cmdBufferLevel == VK_COMMAND_BUFFER_LEVEL_PRIMARY) {
      bVar6 = submitAndCheck(local_120,&local_118,&local_d8);
      if (!bVar6) {
        local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
             (deUint64)
             &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Fail","");
        pTVar14 = local_128;
        local_128->m_code = QP_TEST_RESULT_FAIL;
        (local_128->m_description)._M_dataplus._M_p = (pointer)&(local_128->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128->m_description,
                   local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                   ,(long)&(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                           m_deviceIface)->_vptr_DeviceInterface +
                    local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                    m_internal);
        goto LAB_0042d241;
      }
    }
    do {
      (*vk->_vptr_DeviceInterface[0x48])(vk,pVVar10,local_b8.m_internal,1,ppVVar15);
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._0_4_ = 0x28
      ;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
           (VkDevice)local_b8.m_internal;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ = 1;
      local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ =
           cmdBufferLevel;
      VVar7 = (*vk->_vptr_DeviceInterface[0x47])(vk,pVVar10,&local_148,ppVVar15);
      ::vk::checkResult(VVar7,"vk.allocateCommandBuffers(vkDevice, &cmdBufParams, pCommandBuffers)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0x48e);
      uVar17 = uVar17 + 2;
      ppVVar15 = ppVVar15 + 2;
    } while (uVar17 < 8);
    uVar17 = local_80 + 1;
    local_88 = local_88 + 1;
    local_90 = local_90 + 1;
  } while (uVar17 != 300);
  operator_delete(local_98,0x50);
  ppVVar2 = &local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)ppVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Pass","");
  pTVar14 = local_128;
  local_128->m_code = QP_TEST_RESULT_PASS;
  (local_128->m_description)._M_dataplus._M_p = (pointer)&(local_128->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128->m_description,
             local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (long)&(local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                    m_deviceIface)->_vptr_DeviceInterface +
             local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  if ((VkDevice *)local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
      != ppVVar2) {
    pVVar10 = local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device + 1;
    HVar12.m_internal =
         local_148.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
LAB_0042d320:
    operator_delete((void *)HVar12.m_internal,(ulong)pVVar10);
  }
LAB_0042d325:
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>_>_>_>
  ::~vector(&local_d8);
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_b0,local_b8);
  }
  return pTVar14;
}

Assistant:

tcu::TestStatus trimCommandPoolTest (Context& context, const VkCommandBufferLevel cmdBufferLevel)
{
	if (!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1"))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	//test parameters
	const deUint32							cmdBufferIterationCount	= 300u;
	const deUint32							cmdBufferCount			= 10u;

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	std::vector <VkEventShared>				events;
	for (deUint32 ndx = 0u; ndx < cmdBufferCount; ++ndx)
		events.push_back(makeSharedPtr(createEvent(vk, vkDevice)));

	{
		std::vector<VkCommandBuffer> cmdBuffers(cmdBufferCount);
		createCommadBuffers(vk, vkDevice, cmdBufferCount, *cmdPool, cmdBufferLevel, &cmdBuffers[0]);

		for (deUint32 cmdBufferIterationrNdx = 0; cmdBufferIterationrNdx < cmdBufferIterationCount; ++cmdBufferIterationrNdx)
		{
			addCommandsToBuffer(vk, cmdBuffers, events);

			//Peak, situation when we use a lot more command buffers
			if (cmdBufferIterationrNdx % 10u == 0)
			{
				std::vector<VkCommandBuffer> cmdBuffersPeak(cmdBufferCount * 10u);
				createCommadBuffers(vk, vkDevice, static_cast<deUint32>(cmdBuffersPeak.size()), *cmdPool, cmdBufferLevel, &cmdBuffersPeak[0]);
				addCommandsToBuffer(vk, cmdBuffersPeak, events);

				switch(cmdBufferLevel)
				{
					case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
						if (!submitAndCheck(context, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
						if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffersPeak, events))
							return tcu::TestStatus::fail("Fail");
						break;
					default:
						DE_ASSERT(0);
				}
				vk.freeCommandBuffers(vkDevice, *cmdPool, static_cast<deUint32>(cmdBuffersPeak.size()), &cmdBuffersPeak[0]);
			}

			vk.trimCommandPoolKHR(vkDevice, *cmdPool, (VkCommandPoolTrimFlagsKHR)0);

			switch(cmdBufferLevel)
			{
				case VK_COMMAND_BUFFER_LEVEL_PRIMARY:
					if (!submitAndCheck(context, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				case VK_COMMAND_BUFFER_LEVEL_SECONDARY:
					if (!executeSecondaryCmdBuffer(context, *cmdPool, cmdBuffers, events))
						return tcu::TestStatus::fail("Fail");
					break;
				default:
					DE_ASSERT(0);
			}

			for (deUint32 bufferNdx = cmdBufferIterationrNdx % 3u; bufferNdx < cmdBufferCount; bufferNdx+=2u)
			{
				vk.freeCommandBuffers(vkDevice, *cmdPool, 1u, &cmdBuffers[bufferNdx]);
				createCommadBuffers(vk, vkDevice, 1u, *cmdPool, cmdBufferLevel, &cmdBuffers[bufferNdx]);
			}
		}
	}

	return tcu::TestStatus::pass("Pass");
}